

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O3

int Bmc_FxCompute(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Gia_Man_t *pGia;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *p_01;
  int *piVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  uint iOut;
  long lVar12;
  int iVar13;
  int nCounter;
  int nCubes [2] [2];
  
  pGia = Gia_ManDupOnsetOffset(p);
  piVar6 = (int *)0x0;
  p_00 = Mf_ManGenerateCnf(pGia,8,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  uVar1 = p->vCos->nSize;
  iVar13 = p->vCis->nSize;
  iVar2 = p_00->nVars;
  iVar5 = sat_solver_nvars(s);
  nCubes[0][0] = 0;
  nCubes[0][1] = 0;
  nCubes[1][0] = 0;
  nCubes[1][1] = 0;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar9 = iVar13;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar9;
  if (iVar9 != 0) {
    piVar6 = (int *)malloc((long)iVar9 << 2);
  }
  p_01->pArray = piVar6;
  if (0 < iVar13) {
    iVar13 = -iVar13;
    do {
      Vec_IntPush(p_01,iVar2 + iVar13);
      iVar13 = iVar13 + 1;
    } while (iVar13 != 0);
  }
  sat_solver_setnvars(s,iVar5 + uVar1 * 4);
  if (0 < (int)uVar1) {
    uVar11 = 0;
    do {
      lVar7 = 0;
      bVar4 = true;
      do {
        bVar8 = bVar4;
        lVar12 = 0;
        bVar4 = true;
        do {
          bVar3 = bVar4;
          pcVar10 = "off";
          if (bVar3) {
            pcVar10 = " on";
          }
          printf("Out %3d %sset ",uVar11 & 0xffffffff,pcVar10);
          iOut = (uint)lVar12 | (int)uVar11 * 2;
          iVar13 = Bmc_FxSolve(s,iOut,uVar1 * 2 * (int)lVar7 + iVar5 + iOut,p_01,0,0,&nCounter,
                               (Vec_Wec_t *)0x0);
          pcVar10 = "Mismatch";
          if (iVar13 == 0) {
LAB_00520529:
            puts(pcVar10);
          }
          else if (iVar13 == -1) {
            pcVar10 = "Timeout";
            goto LAB_00520529;
          }
          nCubes[lVar7][lVar12] = nCubes[lVar7][lVar12] + nCounter;
          lVar12 = 1;
          bVar4 = false;
        } while (bVar3);
        lVar7 = 1;
        bVar4 = false;
      } while (bVar8);
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar1);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  sat_solver_delete(s);
  Cnf_DataFree(p_00);
  Gia_ManStop(pGia);
  printf("Onset = %5d.   Offset = %5d.      Onset = %5d.   Offset = %5d.\n",
         (ulong)nCubes[0] & 0xffffffff,(ulong)nCubes[0] >> 0x20,(ulong)nCubes[1] & 0xffffffff,
         (ulong)nCubes[1] >> 0x20);
  return 1;
}

Assistant:

int Bmc_FxCompute( Gia_Man_t * p )
{
    // create dual-output circuit with on-set/off-set
    extern Gia_Man_t * Gia_ManDupOnsetOffset( Gia_Man_t * p );
    Gia_Man_t * p2 = Gia_ManDupOnsetOffset( p );
    // create SAT solver
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p2, 8, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    // compute parameters
    int nOuts = Gia_ManCoNum(p);
    int nCiVars = Gia_ManCiNum(p), iCiVarBeg = pCnf->nVars - nCiVars;// - 1;
    int o, i, n, RetValue, nCounter, iAuxVarStart = sat_solver_nvars( pSat );
    int nCubes[2][2] = {{0}};
    // create variables
    Vec_Int_t * vVars = Vec_IntAlloc( nCiVars );
    for ( n = 0; n < nCiVars; n++ )
        Vec_IntPush( vVars, iCiVarBeg + n );
    sat_solver_setnvars( pSat, iAuxVarStart + 4*nOuts );
    // iterate through outputs
    for ( o = 0; o < nOuts; o++ )
    for ( i = 0; i < 2; i++ )
    for ( n = 0; n < 2; n++ ) // 0=onset, 1=offset
//    for ( n = 1; n >= 0; n-- ) // 0=onset, 1=offset
    {
        printf( "Out %3d %sset ", o, n ? "off" : " on" );
        RetValue = Bmc_FxSolve( pSat, Abc_Var2Lit(o, n), iAuxVarStart + 2*i*nOuts + Abc_Var2Lit(o, n), vVars, 0, 0, &nCounter, NULL );
        if ( RetValue == 0 )
            printf( "Mismatch\n" );
        if ( RetValue == -1 )
            printf( "Timeout\n" );
        nCubes[i][n] += nCounter;
    }
    // cleanup
    Vec_IntFree( vVars );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( p2 );
    printf( "Onset = %5d.   Offset = %5d.      Onset = %5d.   Offset = %5d.\n", nCubes[0][0], nCubes[0][1], nCubes[1][0], nCubes[1][1] );
    return 1;
}